

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O1

bool __thiscall
google::protobuf::DescriptorBuilder::OptionInterpreter::SetOptionValue
          (OptionInterpreter *this,FieldDescriptor *option_field,UnknownFieldSet *unknown_fields)

{
  DescriptorPool *pDVar1;
  char *pcVar2;
  double value;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error;
  bool bVar3;
  anon_union_80_1_493b367e_for_UninterpretedOption_3 aVar4;
  bool bVar5;
  int iVar6;
  DescriptorPool *pDVar7;
  Symbol SVar8;
  string *psVar9;
  Type type;
  UninterpretedOption *pUVar10;
  ulong uVar11;
  int64_t value_00;
  pointer pcVar12;
  uint64_t uVar13;
  code *pcVar14;
  byte unaff_BPL;
  size_type sVar15;
  DescriptorBuilder *this_00;
  ulong *puVar16;
  float value_01;
  string_view name;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_00;
  string_view name_00;
  string_view element_name;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_01;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_02;
  string fully_qualified_name;
  EnumDescriptor *enum_type;
  FieldDescriptor *local_78;
  VoidPtr local_70;
  Invoker<std::__cxx11::basic_string<char>_> p_Stack_68;
  long local_60 [2];
  EnumDescriptor *local_50;
  EnumDescriptor **local_48;
  ulong *local_40;
  FieldDescriptor **local_38;
  
  if (9 < *(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)option_field->type_ * 4) - 1U)
  goto LAB_003acf3c;
  type = (Type)option_field->type_;
  local_78 = option_field;
  switch(*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)option_field->type_ * 4)) {
  case 1:
    pUVar10 = this->uninterpreted_option_;
    if (((undefined1  [80])pUVar10->field_0 & (undefined1  [80])0x8) == (undefined1  [80])0x0) {
      if (((undefined1  [80])pUVar10->field_0 & (undefined1  [80])0x10) != (undefined1  [80])0x0) {
        uVar11 = *(ulong *)((long)&pUVar10->field_0 + 0x40);
        if ((long)uVar11 < -0x80000000) {
          pcVar14 = absl::lts_20250127::functional_internal::
                    InvokeObject<google::protobuf::DescriptorBuilder::OptionInterpreter::SetOptionValue(google::protobuf::FieldDescriptor_const*,google::protobuf::UnknownFieldSet*)::__1,std::__cxx11::string>
          ;
LAB_003acd52:
          local_70.obj = &local_78;
          make_error_00.ptr_.obj = &local_70;
          make_error_00.invoker_ = pcVar14;
          unaff_BPL = AddValueError(this,make_error_00);
          goto LAB_003acf3f;
        }
LAB_003acd61:
        SetInt32(this,option_field->number_,(int32_t)uVar11,type,unknown_fields);
        goto LAB_003acf3c;
      }
      this_00 = this->builder_;
      pcVar12 = (this->options_to_interpret_->element_name)._M_dataplus._M_p;
      sVar15 = (this->options_to_interpret_->element_name)._M_string_length;
      p_Stack_68 = absl::lts_20250127::functional_internal::
                   InvokeObject<google::protobuf::DescriptorBuilder::OptionInterpreter::SetOptionValue(google::protobuf::FieldDescriptor_const*,google::protobuf::UnknownFieldSet*)::__2,std::__cxx11::string>
      ;
    }
    else {
      uVar11 = *(ulong *)((long)&pUVar10->field_0 + 0x38);
      if ((uVar11 & 0xffffffff80000000) == 0) goto LAB_003acd61;
      this_00 = this->builder_;
      pcVar12 = (this->options_to_interpret_->element_name)._M_dataplus._M_p;
      sVar15 = (this->options_to_interpret_->element_name)._M_string_length;
      p_Stack_68 = absl::lts_20250127::functional_internal::
                   InvokeObject<google::protobuf::DescriptorBuilder::OptionInterpreter::SetOptionValue(google::protobuf::FieldDescriptor_const*,google::protobuf::UnknownFieldSet*)::__0,std::__cxx11::string>
      ;
    }
    break;
  case 2:
    pUVar10 = this->uninterpreted_option_;
    if (((undefined1  [80])pUVar10->field_0 & (undefined1  [80])0x8) == (undefined1  [80])0x0) {
      if (((undefined1  [80])pUVar10->field_0 & (undefined1  [80])0x10) != (undefined1  [80])0x0) {
        iVar6 = option_field->number_;
        value_00 = *(int64_t *)((long)&pUVar10->field_0 + 0x40);
LAB_003acd78:
        SetInt64(this,iVar6,value_00,type,unknown_fields);
        goto LAB_003acf3c;
      }
      this_00 = this->builder_;
      pcVar12 = (this->options_to_interpret_->element_name)._M_dataplus._M_p;
      sVar15 = (this->options_to_interpret_->element_name)._M_string_length;
      p_Stack_68 = absl::lts_20250127::functional_internal::
                   InvokeObject<google::protobuf::DescriptorBuilder::OptionInterpreter::SetOptionValue(google::protobuf::FieldDescriptor_const*,google::protobuf::UnknownFieldSet*)::__4,std::__cxx11::string>
      ;
    }
    else {
      value_00 = *(long *)((long)&pUVar10->field_0 + 0x38);
      if (-1 < value_00) {
        iVar6 = option_field->number_;
        goto LAB_003acd78;
      }
      this_00 = this->builder_;
      pcVar12 = (this->options_to_interpret_->element_name)._M_dataplus._M_p;
      sVar15 = (this->options_to_interpret_->element_name)._M_string_length;
      p_Stack_68 = absl::lts_20250127::functional_internal::
                   InvokeObject<google::protobuf::DescriptorBuilder::OptionInterpreter::SetOptionValue(google::protobuf::FieldDescriptor_const*,google::protobuf::UnknownFieldSet*)::__3,std::__cxx11::string>
      ;
    }
    break;
  case 3:
    pUVar10 = this->uninterpreted_option_;
    if ((undefined1  [80])((undefined1  [80])pUVar10->field_0 & (undefined1  [80])0x8) ==
        (undefined1  [80])0x0) {
      this_00 = this->builder_;
      pcVar12 = (this->options_to_interpret_->element_name)._M_dataplus._M_p;
      sVar15 = (this->options_to_interpret_->element_name)._M_string_length;
      p_Stack_68 = absl::lts_20250127::functional_internal::
                   InvokeObject<google::protobuf::DescriptorBuilder::OptionInterpreter::SetOptionValue(google::protobuf::FieldDescriptor_const*,google::protobuf::UnknownFieldSet*)::__6,std::__cxx11::string>
      ;
    }
    else {
      uVar11 = *(ulong *)((long)&pUVar10->field_0 + 0x38);
      if (uVar11 >> 0x20 == 0) {
        SetUInt32((OptionInterpreter *)0x0,option_field->number_,(uint32_t)uVar11,type,
                  unknown_fields);
        goto LAB_003acf3c;
      }
      this_00 = this->builder_;
      pcVar12 = (this->options_to_interpret_->element_name)._M_dataplus._M_p;
      sVar15 = (this->options_to_interpret_->element_name)._M_string_length;
      p_Stack_68 = absl::lts_20250127::functional_internal::
                   InvokeObject<google::protobuf::DescriptorBuilder::OptionInterpreter::SetOptionValue(google::protobuf::FieldDescriptor_const*,google::protobuf::UnknownFieldSet*)::__5,std::__cxx11::string>
      ;
    }
    break;
  case 4:
    pUVar10 = this->uninterpreted_option_;
    if ((undefined1  [80])((undefined1  [80])pUVar10->field_0 & (undefined1  [80])0x8) !=
        (undefined1  [80])0x0) {
      SetUInt64(this,option_field->number_,*(uint64_t *)((long)&pUVar10->field_0 + 0x38),type,
                unknown_fields);
      goto LAB_003acf3c;
    }
    this_00 = this->builder_;
    pcVar12 = (this->options_to_interpret_->element_name)._M_dataplus._M_p;
    sVar15 = (this->options_to_interpret_->element_name)._M_string_length;
    p_Stack_68 = absl::lts_20250127::functional_internal::
                 InvokeObject<google::protobuf::DescriptorBuilder::OptionInterpreter::SetOptionValue(google::protobuf::FieldDescriptor_const*,google::protobuf::UnknownFieldSet*)::__7,std::__cxx11::string>
    ;
    break;
  case 5:
    pUVar10 = this->uninterpreted_option_;
    aVar4 = pUVar10->field_0;
    if (((undefined1  [80])aVar4 & (undefined1  [80])0x20) == (undefined1  [80])0x0) {
      if (((undefined1  [80])aVar4 & (undefined1  [80])0x8) == (undefined1  [80])0x0) {
        if (((undefined1  [80])aVar4 & (undefined1  [80])0x10) == (undefined1  [80])0x0) {
          iVar6 = std::__cxx11::string::compare
                            ((char *)((ulong)(pUVar10->field_0)._impl_.identifier_value_.tagged_ptr_
                                             .ptr_ & 0xfffffffffffffffc));
          if (iVar6 == 0) {
            value = INFINITY;
            goto LAB_003acf21;
          }
          iVar6 = std::__cxx11::string::compare
                            ((char *)((ulong)(this->uninterpreted_option_->field_0)._impl_.
                                             identifier_value_.tagged_ptr_.ptr_ & 0xfffffffffffffffc
                                     ));
          if (iVar6 == 0) {
            value = NAN;
            goto LAB_003acf21;
          }
          pcVar14 = absl::lts_20250127::functional_internal::
                    InvokeObject<google::protobuf::DescriptorBuilder::OptionInterpreter::SetOptionValue(google::protobuf::FieldDescriptor_const*,google::protobuf::UnknownFieldSet*)::__9,std::__cxx11::string>
          ;
LAB_003acef4:
          local_70.obj = &local_78;
          make_error_02.ptr_.obj = &local_70;
          make_error_02.invoker_ = pcVar14;
          unaff_BPL = AddValueError(this,make_error_02);
          bVar3 = true;
          goto LAB_003acf38;
        }
        value = (double)(pUVar10->field_0)._impl_.negative_int_value_;
      }
      else {
        uVar13 = (pUVar10->field_0)._impl_.positive_int_value_;
        value = ((double)CONCAT44(0x45300000,(int)(uVar13 >> 0x20)) - 1.9342813113834067e+25) +
                ((double)CONCAT44(0x43300000,(int)uVar13) - 4503599627370496.0);
      }
    }
    else {
      value = (pUVar10->field_0)._impl_.double_value_;
    }
LAB_003acf21:
    UnknownFieldSet::AddFixed64(unknown_fields,local_78->number_,(uint64_t)value);
    goto LAB_003acf36;
  case 6:
    pUVar10 = this->uninterpreted_option_;
    aVar4 = pUVar10->field_0;
    if (((undefined1  [80])aVar4 & (undefined1  [80])0x20) == (undefined1  [80])0x0) {
      if (((undefined1  [80])aVar4 & (undefined1  [80])0x8) == (undefined1  [80])0x0) {
        if (((undefined1  [80])aVar4 & (undefined1  [80])0x10) == (undefined1  [80])0x0) {
          iVar6 = std::__cxx11::string::compare
                            ((char *)((ulong)(pUVar10->field_0)._impl_.identifier_value_.tagged_ptr_
                                             .ptr_ & 0xfffffffffffffffc));
          if (iVar6 == 0) {
            value_01 = INFINITY;
          }
          else {
            iVar6 = std::__cxx11::string::compare
                              ((char *)((ulong)(this->uninterpreted_option_->field_0)._impl_.
                                               identifier_value_.tagged_ptr_.ptr_ &
                                       0xfffffffffffffffc));
            if (iVar6 != 0) {
              pcVar14 = absl::lts_20250127::functional_internal::
                        InvokeObject<google::protobuf::DescriptorBuilder::OptionInterpreter::SetOptionValue(google::protobuf::FieldDescriptor_const*,google::protobuf::UnknownFieldSet*)::__8,std::__cxx11::string>
              ;
              goto LAB_003acef4;
            }
            value_01 = NAN;
          }
        }
        else {
          value_01 = (float)(pUVar10->field_0)._impl_.negative_int_value_;
        }
      }
      else {
        uVar11 = (pUVar10->field_0)._impl_.positive_int_value_;
        if ((long)uVar11 < 0) {
          value_01 = (float)uVar11;
        }
        else {
          value_01 = (float)(long)uVar11;
        }
      }
    }
    else {
      value_01 = (float)(pUVar10->field_0)._impl_.double_value_;
    }
    UnknownFieldSet::AddFixed32(unknown_fields,local_78->number_,(uint32_t)value_01);
LAB_003acf36:
    bVar3 = false;
LAB_003acf38:
    if (!bVar3) {
LAB_003acf3c:
      unaff_BPL = 1;
    }
    goto LAB_003acf3f;
  case 7:
    pUVar10 = this->uninterpreted_option_;
    if ((undefined1  [80])((undefined1  [80])pUVar10->field_0 & (undefined1  [80])0x1) !=
        (undefined1  [80])0x0) {
      iVar6 = std::__cxx11::string::compare
                        ((char *)((ulong)(pUVar10->field_0)._impl_.identifier_value_.tagged_ptr_.
                                         ptr_ & 0xfffffffffffffffc));
      if (iVar6 == 0) {
        uVar13 = 1;
      }
      else {
        iVar6 = std::__cxx11::string::compare
                          ((char *)((ulong)(this->uninterpreted_option_->field_0)._impl_.
                                           identifier_value_.tagged_ptr_.ptr_ & 0xfffffffffffffffc))
        ;
        if (iVar6 != 0) {
          pcVar14 = absl::lts_20250127::functional_internal::
                    InvokeObject<google::protobuf::DescriptorBuilder::OptionInterpreter::SetOptionValue(google::protobuf::FieldDescriptor_const*,google::protobuf::UnknownFieldSet*)::__11,std::__cxx11::string>
          ;
          goto LAB_003acd52;
        }
        uVar13 = 0;
      }
      UnknownFieldSet::AddVarint(unknown_fields,local_78->number_,uVar13);
      goto LAB_003acf3c;
    }
    this_00 = this->builder_;
    pcVar12 = (this->options_to_interpret_->element_name)._M_dataplus._M_p;
    sVar15 = (this->options_to_interpret_->element_name)._M_string_length;
    p_Stack_68 = absl::lts_20250127::functional_internal::
                 InvokeObject<google::protobuf::DescriptorBuilder::OptionInterpreter::SetOptionValue(google::protobuf::FieldDescriptor_const*,google::protobuf::UnknownFieldSet*)::__10,std::__cxx11::string>
    ;
    break;
  case 8:
    pUVar10 = this->uninterpreted_option_;
    if ((undefined1  [80])((undefined1  [80])pUVar10->field_0 & (undefined1  [80])0x1) ==
        (undefined1  [80])0x0) {
      this_00 = this->builder_;
      pcVar12 = (this->options_to_interpret_->element_name)._M_dataplus._M_p;
      sVar15 = (this->options_to_interpret_->element_name)._M_string_length;
      p_Stack_68 = absl::lts_20250127::functional_internal::
                   InvokeObject<google::protobuf::DescriptorBuilder::OptionInterpreter::SetOptionValue(google::protobuf::FieldDescriptor_const*,google::protobuf::UnknownFieldSet*)::__12,std::__cxx11::string>
      ;
      break;
    }
    local_50 = FieldDescriptor::enum_type(option_field);
    puVar16 = (ulong *)((ulong)(this->uninterpreted_option_->field_0)._impl_.identifier_value_.
                               tagged_ptr_.ptr_ & 0xfffffffffffffffc);
    pDVar1 = local_50->file_->pool_;
    pDVar7 = DescriptorPool::internal_generated_pool();
    DescriptorProto::GetMetadata((DescriptorProto *)_DescriptorProto_default_instance_);
    pb::CppFeatures::GetMetadata((CppFeatures *)pb::_CppFeatures_default_instance_);
    if (pDVar1 == pDVar7) {
      name_00._M_str = (char *)*puVar16;
      name_00._M_len = puVar16[1];
      SVar8.ptr_ = (SymbolBase *)EnumDescriptor::FindValueByName(local_50,name_00);
LAB_003acebf:
      if ((EnumValueDescriptor *)SVar8.ptr_ == (EnumValueDescriptor *)0x0) {
        pcVar14 = absl::lts_20250127::functional_internal::
                  InvokeObject<google::protobuf::DescriptorBuilder::OptionInterpreter::SetOptionValue(google::protobuf::FieldDescriptor_const*,google::protobuf::UnknownFieldSet*)::__14,std::__cxx11::string>
        ;
        p_Stack_68 = (Invoker<std::__cxx11::basic_string<char>_>)puVar16;
        goto LAB_003acef4;
      }
      UnknownFieldSet::AddVarint
                (unknown_fields,local_78->number_,(long)((EnumValueDescriptor *)SVar8.ptr_)->number_
                );
      bVar3 = false;
    }
    else {
      pcVar2 = (local_50->all_names_).payload_;
      local_70.obj = local_60;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_70,pcVar2 + ~(ulong)*(ushort *)(pcVar2 + 2),pcVar2 + -1);
      std::__cxx11::string::resize
                ((ulong)&local_70,
                 (char)p_Stack_68 - (char)*(undefined2 *)(local_50->all_names_).payload_);
      std::__cxx11::string::_M_append((char *)&local_70,*puVar16);
      name._M_str = (char *)local_70.obj;
      name._M_len = (size_t)p_Stack_68;
      SVar8 = FindSymbolNotEnforcingDeps(this->builder_,name,true);
      if ((SVar8.ptr_)->symbol_type_ != '\x05') {
        if ((SVar8.ptr_)->symbol_type_ == '\x06') {
          SVar8.ptr_ = SVar8.ptr_ + -1;
        }
        else {
          SVar8.ptr_ = (SymbolBase *)0x0;
        }
      }
      bVar5 = true;
      if ((EnumValueDescriptor *)SVar8.ptr_ == (EnumValueDescriptor *)0x0) {
        SVar8.ptr_ = (SymbolBase *)0x0;
      }
      else if (((EnumValueDescriptor *)SVar8.ptr_)->type_ != local_50) {
        local_48 = &local_50;
        local_38 = &local_78;
        make_error_01.invoker_ =
             absl::lts_20250127::functional_internal::
             InvokeObject<google::protobuf::DescriptorBuilder::OptionInterpreter::SetOptionValue(google::protobuf::FieldDescriptor_const*,google::protobuf::UnknownFieldSet*)::__13,std::__cxx11::string>
        ;
        make_error_01.ptr_.obj = &local_48;
        local_40 = puVar16;
        unaff_BPL = AddValueError(this,make_error_01);
        SVar8.ptr_ = (SymbolBase *)0x0;
        bVar5 = false;
      }
      if ((long *)local_70.obj != local_60) {
        operator_delete(local_70.obj,local_60[0] + 1);
      }
      bVar3 = true;
      if (bVar5) goto LAB_003acebf;
    }
    goto LAB_003acf38;
  case 9:
    pUVar10 = this->uninterpreted_option_;
    if ((undefined1  [80])((undefined1  [80])pUVar10->field_0 & (undefined1  [80])0x2) !=
        (undefined1  [80])0x0) {
      uVar11 = *(ulong *)((ulong)(pUVar10->field_0)._impl_.string_value_.tagged_ptr_.ptr_ &
                         0xfffffffffffffffc);
      psVar9 = UnknownFieldSet::AddLengthDelimited_abi_cxx11_(unknown_fields,option_field->number_);
      std::__cxx11::string::_M_replace((ulong)psVar9,0,(char *)psVar9->_M_string_length,uVar11);
      goto LAB_003acf3c;
    }
    this_00 = this->builder_;
    pcVar12 = (this->options_to_interpret_->element_name)._M_dataplus._M_p;
    sVar15 = (this->options_to_interpret_->element_name)._M_string_length;
    p_Stack_68 = absl::lts_20250127::functional_internal::
                 InvokeObject<google::protobuf::DescriptorBuilder::OptionInterpreter::SetOptionValue(google::protobuf::FieldDescriptor_const*,google::protobuf::UnknownFieldSet*)::__15,std::__cxx11::string>
    ;
    break;
  case 10:
    bVar5 = SetAggregateOption(this,option_field,unknown_fields);
    if (bVar5) goto LAB_003acf3c;
    goto LAB_003acdfb;
  }
  local_48 = (EnumDescriptor **)&local_78;
  local_70.obj = &local_48;
  make_error.invoker_ = p_Stack_68;
  make_error.ptr_.obj = local_70.obj;
  element_name._M_str = pcVar12;
  element_name._M_len = sVar15;
  AddError(this_00,element_name,&pUVar10->super_Message,OPTION_VALUE,make_error);
LAB_003acdfb:
  unaff_BPL = 0;
LAB_003acf3f:
  return (bool)(unaff_BPL & 1);
}

Assistant:

bool DescriptorBuilder::OptionInterpreter::SetOptionValue(
    const FieldDescriptor* option_field, UnknownFieldSet* unknown_fields) {
  // We switch on the CppType to validate.
  switch (option_field->cpp_type()) {
    case FieldDescriptor::CPPTYPE_INT32:
      if (uninterpreted_option_->has_positive_int_value()) {
        if (uninterpreted_option_->positive_int_value() >
            static_cast<uint64_t>(std::numeric_limits<int32_t>::max())) {
          return AddValueError([&] {
            return ValueOutOfRange<int32_t>("int32", option_field->full_name());
          });
        } else {
          SetInt32(option_field->number(),
                   uninterpreted_option_->positive_int_value(),
                   option_field->type(), unknown_fields);
        }
      } else if (uninterpreted_option_->has_negative_int_value()) {
        if (uninterpreted_option_->negative_int_value() <
            static_cast<int64_t>(std::numeric_limits<int32_t>::min())) {
          return AddValueError([&] {
            return ValueOutOfRange<int32_t>("int32", option_field->full_name());
          });
        } else {
          SetInt32(option_field->number(),
                   uninterpreted_option_->negative_int_value(),
                   option_field->type(), unknown_fields);
        }
      } else {
        return AddValueError([&] {
          return ValueMustBeInt<int32_t>("int32", option_field->full_name());
        });
      }
      break;

    case FieldDescriptor::CPPTYPE_INT64:
      if (uninterpreted_option_->has_positive_int_value()) {
        if (uninterpreted_option_->positive_int_value() >
            static_cast<uint64_t>(std::numeric_limits<int64_t>::max())) {
          return AddValueError([&] {
            return ValueOutOfRange<int64_t>("int64", option_field->full_name());
          });
        } else {
          SetInt64(option_field->number(),
                   uninterpreted_option_->positive_int_value(),
                   option_field->type(), unknown_fields);
        }
      } else if (uninterpreted_option_->has_negative_int_value()) {
        SetInt64(option_field->number(),
                 uninterpreted_option_->negative_int_value(),
                 option_field->type(), unknown_fields);
      } else {
        return AddValueError([&] {
          return ValueMustBeInt<int64_t>("int64", option_field->full_name());
        });
      }
      break;

    case FieldDescriptor::CPPTYPE_UINT32:
      if (uninterpreted_option_->has_positive_int_value()) {
        if (uninterpreted_option_->positive_int_value() >
            std::numeric_limits<uint32_t>::max()) {
          return AddValueError([&] {
            return ValueOutOfRange<uint32_t>("uint32",
                                             option_field->full_name());
          });
        } else {
          SetUInt32(option_field->number(),
                    uninterpreted_option_->positive_int_value(),
                    option_field->type(), unknown_fields);
        }
      } else {
        return AddValueError([&] {
          return ValueMustBeInt<uint32_t>("uint32", option_field->full_name());
        });
      }
      break;

    case FieldDescriptor::CPPTYPE_UINT64:
      if (uninterpreted_option_->has_positive_int_value()) {
        SetUInt64(option_field->number(),
                  uninterpreted_option_->positive_int_value(),
                  option_field->type(), unknown_fields);
      } else {
        return AddValueError([&] {
          return ValueMustBeInt<uint64_t>("uint64", option_field->full_name());
        });
      }
      break;

    case FieldDescriptor::CPPTYPE_FLOAT: {
      float value;
      if (uninterpreted_option_->has_double_value()) {
        value = uninterpreted_option_->double_value();
      } else if (uninterpreted_option_->has_positive_int_value()) {
        value = uninterpreted_option_->positive_int_value();
      } else if (uninterpreted_option_->has_negative_int_value()) {
        value = uninterpreted_option_->negative_int_value();
      } else if (uninterpreted_option_->identifier_value() == "inf") {
        value = std::numeric_limits<float>::infinity();
      } else if (uninterpreted_option_->identifier_value() == "nan") {
        value = std::numeric_limits<float>::quiet_NaN();
      } else {
        return AddValueError([&] {
          return absl::StrCat("Value must be number for float option \"",
                              option_field->full_name(), "\".");
        });
      }
      unknown_fields->AddFixed32(option_field->number(),
                                 internal::WireFormatLite::EncodeFloat(value));
      break;
    }

    case FieldDescriptor::CPPTYPE_DOUBLE: {
      double value;
      if (uninterpreted_option_->has_double_value()) {
        value = uninterpreted_option_->double_value();
      } else if (uninterpreted_option_->has_positive_int_value()) {
        value = uninterpreted_option_->positive_int_value();
      } else if (uninterpreted_option_->has_negative_int_value()) {
        value = uninterpreted_option_->negative_int_value();
      } else if (uninterpreted_option_->identifier_value() == "inf") {
        value = std::numeric_limits<double>::infinity();
      } else if (uninterpreted_option_->identifier_value() == "nan") {
        value = std::numeric_limits<double>::quiet_NaN();
      } else {
        return AddValueError([&] {
          return absl::StrCat("Value must be number for double option \"",
                              option_field->full_name(), "\".");
        });
      }
      unknown_fields->AddFixed64(option_field->number(),
                                 internal::WireFormatLite::EncodeDouble(value));
      break;
    }

    case FieldDescriptor::CPPTYPE_BOOL:
      uint64_t value;
      if (!uninterpreted_option_->has_identifier_value()) {
        return AddValueError([&] {
          return absl::StrCat("Value must be identifier for boolean option \"",
                              option_field->full_name(), "\".");
        });
      }
      if (uninterpreted_option_->identifier_value() == "true") {
        value = 1;
      } else if (uninterpreted_option_->identifier_value() == "false") {
        value = 0;
      } else {
        return AddValueError([&] {
          return absl::StrCat(
              "Value must be \"true\" or \"false\" for boolean option \"",
              option_field->full_name(), "\".");
        });
      }
      unknown_fields->AddVarint(option_field->number(), value);
      break;

    case FieldDescriptor::CPPTYPE_ENUM: {
      if (!uninterpreted_option_->has_identifier_value()) {
        return AddValueError([&] {
          return absl::StrCat(
              "Value must be identifier for enum-valued option \"",
              option_field->full_name(), "\".");
        });
      }
      const EnumDescriptor* enum_type = option_field->enum_type();
      const std::string& value_name = uninterpreted_option_->identifier_value();
      const EnumValueDescriptor* enum_value = nullptr;

      if (enum_type->file()->pool() != DescriptorPool::generated_pool()) {
        // Note that the enum value's fully-qualified name is a sibling of the
        // enum's name, not a child of it.
        std::string fully_qualified_name = std::string(enum_type->full_name());
        fully_qualified_name.resize(fully_qualified_name.size() -
                                    enum_type->name().size());
        fully_qualified_name += value_name;

        // Search for the enum value's descriptor in the builder's pool. Note
        // that we use DescriptorBuilder::FindSymbolNotEnforcingDeps(), not
        // DescriptorPool::FindEnumValueByName() because we're already holding
        // the pool's mutex, and the latter method locks it again.
        Symbol symbol =
            builder_->FindSymbolNotEnforcingDeps(fully_qualified_name);
        if (auto* candidate_descriptor = symbol.enum_value_descriptor()) {
          if (candidate_descriptor->type() != enum_type) {
            return AddValueError([&] {
              return absl::StrCat(
                  "Enum type \"", enum_type->full_name(),
                  "\" has no value named \"", value_name, "\" for option \"",
                  option_field->full_name(),
                  "\". This appears to be a value from a sibling type.");
            });
          } else {
            enum_value = candidate_descriptor;
          }
        }
      } else {
        // The enum type is in the generated pool, so we can search for the
        // value there.
        enum_value = enum_type->FindValueByName(value_name);
      }

      if (enum_value == nullptr) {
        return AddValueError([&] {
          return absl::StrCat(
              "Enum type \"", option_field->enum_type()->full_name(),
              "\" has no value named \"", value_name, "\" for option \"",
              option_field->full_name(), "\".");
        });
      } else {
        // Sign-extension is not a problem, since we cast directly from int32_t
        // to uint64_t, without first going through uint32_t.
        unknown_fields->AddVarint(
            option_field->number(),
            static_cast<uint64_t>(static_cast<int64_t>(enum_value->number())));
      }
      break;
    }

    case FieldDescriptor::CPPTYPE_STRING:
      if (!uninterpreted_option_->has_string_value()) {
        return AddValueError([&] {
          return absl::StrCat(
              "Value must be quoted string for string option \"",
              option_field->full_name(), "\".");
        });
      }
      // The string has already been unquoted and unescaped by the parser.
      unknown_fields->AddLengthDelimited(option_field->number(),
                                         uninterpreted_option_->string_value());
      break;

    case FieldDescriptor::CPPTYPE_MESSAGE:
      if (!SetAggregateOption(option_field, unknown_fields)) {
        return false;
      }
      break;
  }

  return true;
}